

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

int * PeerArray(int MySize,int MyRank,int PeerSize)

{
  undefined1 auVar1 [16];
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  iVar4 = PeerSize % MySize;
  uVar6 = (uint)(MyRank < iVar4) + PeerSize / MySize;
  piVar2 = (int *)malloc((long)(int)uVar6 * 4 + 4);
  auVar1 = _DAT_0011f680;
  if (0 < (int)uVar6) {
    iVar3 = 0;
    if (iVar4 <= MyRank) {
      iVar3 = iVar4;
    }
    lVar5 = (ulong)uVar6 - 1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    iVar3 = iVar3 + uVar6 * MyRank;
    lVar5 = 1;
    auVar7 = auVar7 ^ _DAT_0011f680;
    auVar8 = _DAT_0011f670;
    do {
      auVar10 = auVar8 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        piVar2[lVar5 + -1] = iVar3;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        piVar2[lVar5] = iVar3 + 1;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar9 = lVar5 - (ulong)(uVar6 + 1 & 0xfffffffe);
      lVar5 = lVar5 + 2;
      iVar3 = iVar3 + 2;
    } while (lVar9 != -1);
  }
  piVar2[(int)uVar6] = -1;
  return piVar2;
}

Assistant:

static int *PeerArray(int MySize, int MyRank, int PeerSize)
{
    int PortionSize = PeerSize / MySize;
    int Leftovers = PeerSize - PortionSize * MySize;
    int StartOffset = Leftovers;
    int Start;
    if (MyRank < Leftovers)
    {
        PortionSize++;
        StartOffset = 0;
    }
    Start = PortionSize * MyRank + StartOffset;
    int *MyPeers = malloc((PortionSize + 1) * sizeof(int));
    for (int i = 0; i < PortionSize; i++)
    {
        MyPeers[i] = Start + i;
    }
    MyPeers[PortionSize] = -1;

    return MyPeers;
}